

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_mutex(void)

{
  int iVar1;
  undefined1 *unaff_RBX;
  uv_mutex_t mutex;
  undefined1 auStack_c8 [8];
  code *pcStack_c0;
  undefined1 auStack_b0 [56];
  code *pcStack_78;
  undefined1 auStack_68 [40];
  undefined1 local_30 [40];
  
  iVar1 = uv_mutex_init(local_30);
  if (iVar1 == 0) {
    uv_mutex_lock(local_30);
    uv_mutex_unlock(local_30);
    uv_mutex_destroy(local_30);
    return 0;
  }
  run_test_thread_mutex_cold_1();
  pcStack_78 = (code *)0x164210;
  iVar1 = uv_mutex_init_recursive(auStack_68);
  if (iVar1 == 0) {
    unaff_RBX = auStack_68;
    pcStack_78 = (code *)0x164221;
    uv_mutex_lock(unaff_RBX);
    pcStack_78 = (code *)0x164229;
    uv_mutex_lock(unaff_RBX);
    pcStack_78 = (code *)0x164231;
    iVar1 = uv_mutex_trylock(unaff_RBX);
    if (iVar1 == 0) {
      pcStack_78 = (code *)0x164242;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x16424a;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x164252;
      uv_mutex_unlock(auStack_68);
      pcStack_78 = (code *)0x16425a;
      uv_mutex_destroy(auStack_68);
      return 0;
    }
  }
  else {
    pcStack_78 = (code *)0x164267;
    run_test_thread_mutex_recursive_cold_1();
  }
  pcStack_78 = run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  pcStack_c0 = (code *)0x16427b;
  pcStack_78 = (code *)unaff_RBX;
  iVar1 = uv_rwlock_init(auStack_b0);
  if (iVar1 == 0) {
    pcStack_c0 = (code *)0x16428c;
    uv_rwlock_rdlock(auStack_b0);
    pcStack_c0 = (code *)0x164294;
    uv_rwlock_rdunlock(auStack_b0);
    pcStack_c0 = (code *)0x16429c;
    uv_rwlock_wrlock(auStack_b0);
    pcStack_c0 = (code *)0x1642a4;
    uv_rwlock_wrunlock(auStack_b0);
    pcStack_c0 = (code *)0x1642ac;
    uv_rwlock_destroy(auStack_b0);
    return 0;
  }
  pcStack_c0 = run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  pcStack_c0 = (code *)unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  if (iVar1 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    if (iVar1 != 0) goto LAB_0016441c;
    iVar1 = uv_rwlock_init(&rwlock);
    if (iVar1 != 0) goto LAB_00164421;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(auStack_c8,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_00164426;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_0016442b;
    synchronize();
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00164430;
    synchronize();
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164435;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_0016443a;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_0016443f;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164444;
    synchronize();
    iVar1 = uv_thread_join(auStack_c8);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_0016441c:
    run_test_thread_rwlock_trylock_cold_2();
LAB_00164421:
    run_test_thread_rwlock_trylock_cold_3();
LAB_00164426:
    run_test_thread_rwlock_trylock_cold_4();
LAB_0016442b:
    run_test_thread_rwlock_trylock_cold_5();
LAB_00164430:
    run_test_thread_rwlock_trylock_cold_6();
LAB_00164435:
    run_test_thread_rwlock_trylock_cold_7();
LAB_0016443a:
    run_test_thread_rwlock_trylock_cold_8();
LAB_0016443f:
    run_test_thread_rwlock_trylock_cold_9();
LAB_00164444:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00164524;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00164529;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_0016452e;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_wrunlock(&rwlock);
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        synchronize();
        uv_rwlock_rdunlock(&rwlock);
        step = step + 1;
        uv_cond_signal(&condvar);
        iVar1 = uv_mutex_unlock(&::mutex);
        return iVar1;
      }
      goto LAB_00164538;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_00164524:
    thread_rwlock_trylock_peer_cold_2();
LAB_00164529:
    thread_rwlock_trylock_peer_cold_3();
LAB_0016452e:
    thread_rwlock_trylock_peer_cold_4();
  }
  thread_rwlock_trylock_peer_cold_5();
LAB_00164538:
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&::mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return step;
  }
  synchronize_cold_1();
  return 0;
}

Assistant:

TEST_IMPL(thread_mutex) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}